

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTport.c
# Opt level: O3

void sbfTportFree(sbfTport tport)

{
  long lVar1;
  ulong uVar2;
  
  pthread_cond_destroy((pthread_cond_t *)&tport->mStreamsCondVar);
  pthread_mutex_destroy((pthread_mutex_t *)&tport->mStreamsLock);
  if (tport->mWeightsListSize != 0) {
    lVar1 = 8;
    uVar2 = 0;
    do {
      regfree((regex_t *)((long)&tport->mWeightsList->mWeight + lVar1));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x48;
    } while (uVar2 < tport->mWeightsListSize);
  }
  free(tport->mWeightsList);
  pthread_mutex_destroy((pthread_mutex_t *)&tport->mWeightsLock);
  sbfKeyValue_destroy(tport->mProperties);
  free(tport->mName);
  free(tport);
  return;
}

Assistant:

static void
sbfTportFree (sbfTport tport)
{
    u_int i;

    sbfCondVar_destroy (&tport->mStreamsCondVar);
    sbfMutex_destroy (&tport->mStreamsLock);

    for (i = 0; i < tport->mWeightsListSize; i++)
        regfree (&tport->mWeightsList[i].mPattern);
    free (tport->mWeightsList);
    sbfMutex_destroy (&tport->mWeightsLock);

    sbfKeyValue_destroy (tport->mProperties);

    free ((void*)tport->mName);
    free (tport);
}